

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

string * __thiscall
kratos::SystemVerilogCodeGen::get_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  detail *this_00;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  long *local_78;
  undefined8 uStack_70;
  long *local_68;
  undefined8 uStack_60;
  long local_58 [2];
  detail *local_48;
  string format;
  
  format._M_dataplus._M_p = (pointer)0x0;
  format._M_string_length._0_1_ = 0;
  pcVar1 = "[({0})-1:0]";
  if (*(int *)&(this->stream_).super_stringstream.field_0x80 == 5) {
    pcVar1 = "[{0}-1:0]";
  }
  local_48 = (detail *)&format._M_string_length;
  std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,(ulong)pcVar1);
  this_00 = local_48;
  (*this->_vptr_SystemVerilogCodeGen[0x1f])(&local_68,this);
  local_78 = local_68;
  uStack_70 = uStack_60;
  pcVar1 = (char *)strlen((char *)this_00);
  format_str.size_ = 0xd;
  format_str.data_ = pcVar1;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,this_00,format_str,args);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != (detail *)&format._M_string_length) {
    operator_delete(local_48,CONCAT71(format._M_string_length._1_7_,
                                      (undefined1)format._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_width_str(Var* var) {
    std::string format;
    if (var->type() == VarType::Parameter)
        format = "[{0}-1:0]";
    else
        format = "[({0})-1:0]";
    return ::format(format.c_str(), var->to_string());
}